

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddCas.c
# Opt level: O2

uint Extra_CountMintermsSimple(DdNode *bFunc,uint max)

{
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  if (((ulong)bFunc & 1) == 0) {
    if (bFunc->index == 0x7fffffff) {
      if (s_Terminal == bFunc) {
        max = 0;
      }
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (ulong)max * 0xc00005 + (long)bFunc;
      uVar4 = (ulong)(uint)(SUB164(auVar1 % ZEXT816(0x3b09),0) << 4);
      if ((*(DdNode **)((long)&HHTable2[0].Arg1 + uVar4) == bFunc) &&
         (*(uint *)((long)&HHTable2[0].Arg2 + uVar4) == max)) {
        max = *(uint *)((long)&HHTable2[0].Res + uVar4);
      }
      else {
        uVar2 = Extra_CountMintermsSimple((bFunc->type).kids.E,max);
        uVar3 = Extra_CountMintermsSimple((bFunc->type).kids.T,max);
        uVar2 = (uVar3 >> 1) + (uVar2 >> 1);
        *(DdNode **)((long)&HHTable2[0].Arg1 + uVar4) = bFunc;
        *(uint *)((long)&HHTable2[0].Arg2 + uVar4) = max;
        *(uint *)((long)&HHTable2[0].Res + uVar4) = uVar2;
        max = uVar2;
      }
    }
  }
  else {
    uVar2 = Extra_CountMintermsSimple((DdNode *)((ulong)bFunc & 0xfffffffffffffffe),max);
    max = max - uVar2;
  }
  return max;
}

Assistant:

unsigned Extra_CountMintermsSimple( DdNode * bFunc, unsigned max )
{
    unsigned HKey;

    // normalize
    if ( Cudd_IsComplement(bFunc) )
        return max - Extra_CountMintermsSimple( Cudd_Not(bFunc), max );

    // now it is known that the function is not complemented
    if ( cuddIsConstant(bFunc) )
        return ((bFunc==s_Terminal)? 0: max);

    // check cache
    HKey = hashKey2( bFunc, max, _TABLESIZE_MINT );
    if ( HHTable2[HKey].Arg1 == bFunc && HHTable2[HKey].Arg2 == max )
        return HHTable2[HKey].Res;
    else
    {
        // min = min0/2 + min1/2;
        unsigned min = (Extra_CountMintermsSimple( cuddE(bFunc), max ) >> 1) +
                       (Extra_CountMintermsSimple( cuddT(bFunc), max ) >> 1);

        HHTable2[HKey].Arg1 = bFunc;
        HHTable2[HKey].Arg2 = max;
        HHTable2[HKey].Res  = min;

        return min;
    }
}